

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O0

int match_long(parg_state *ps,int argc,char **argv,char *optstring,parg_option *longopts,
              int *longindex)

{
  int iVar1;
  size_t __n;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int i;
  int match;
  int num_match;
  size_t len;
  int *longindex_local;
  parg_option *longopts_local;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  parg_state *ps_local;
  
  i = 0;
  local_50 = -1;
  __n = strcspn(ps->nextchar,"=");
  local_54 = 0;
  do {
    if (longopts[local_54].name == (char *)0x0) {
LAB_00114502:
      if (i == 1) {
        if (local_50 == -1) {
          __assert_fail("match != -1",
                        "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c"
                        ,0x67,
                        "int match_long(struct parg_state *, int, char *const *, const char *, const struct parg_option *, int *)"
                       );
        }
        if (longindex != (int *)0x0) {
          *longindex = local_50;
        }
        if (ps->nextchar[__n] == '=') {
          if (longopts[local_50].has_arg == 0) {
            if (longopts[local_50].flag == (int *)0x0) {
              local_58 = longopts[local_50].val;
            }
            else {
              local_58 = 0;
            }
            ps->optopt = local_58;
            ps->nextchar = (char *)0x0;
            if (*optstring != ':') {
              return 0x3f;
            }
            return 0x3a;
          }
          ps->optarg = ps->nextchar + __n + 1;
        }
        else if (longopts[local_50].has_arg == 1) {
          iVar1 = is_argv_end(ps,argc,argv);
          if (iVar1 != 0) {
            if (longopts[local_50].flag == (int *)0x0) {
              local_5c = longopts[local_50].val;
            }
            else {
              local_5c = 0;
            }
            ps->optopt = local_5c;
            ps->nextchar = (char *)0x0;
            if (*optstring != ':') {
              return 0x3f;
            }
            return 0x3a;
          }
          iVar1 = ps->optind;
          ps->optind = iVar1 + 1;
          ps->optarg = argv[iVar1];
        }
        ps->nextchar = (char *)0x0;
        if (longopts[local_50].flag == (int *)0x0) {
          ps_local._4_4_ = longopts[local_50].val;
        }
        else {
          *longopts[local_50].flag = longopts[local_50].val;
          ps_local._4_4_ = 0;
        }
      }
      else {
        ps->optopt = 0;
        ps->nextchar = (char *)0x0;
        ps_local._4_4_ = 0x3f;
      }
      return ps_local._4_4_;
    }
    iVar1 = strncmp(ps->nextchar,longopts[local_54].name,__n);
    if (iVar1 == 0) {
      local_50 = local_54;
      i = i + 1;
      if (longopts[local_54].name[__n] == '\0') {
        i = 1;
        goto LAB_00114502;
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

static int
match_long(struct parg_state *ps, int argc, char *const argv[],
           const char *optstring,
           const struct parg_option *longopts, int *longindex)
{
	size_t len;
	int num_match = 0;
	int match = -1;
	int i;

	len = strcspn(ps->nextchar, "=");

	for (i = 0; longopts[i].name; ++i) {
		if (strncmp(ps->nextchar, longopts[i].name, len) == 0) {
			match = i;
			num_match++;
			/* Take if exact match */
			if (longopts[i].name[len] == '\0') {
				num_match = 1;
				break;
			}
		}
	}

	/* Return '?' on no or ambiguous match */
	if (num_match != 1) {
		ps->optopt = 0;
		ps->nextchar = NULL;
		return '?';
	}

	assert(match != -1);

	if (longindex) {
		*longindex = match;
	}

	if (ps->nextchar[len] == '=') {
		/* Option argument present, check if extraneous */
		if (longopts[match].has_arg == PARG_NOARG) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}
		else {
			ps->optarg = &ps->nextchar[len + 1];
		}
	}
	else if (longopts[match].has_arg == PARG_REQARG) {
		/* Option argument required, so return next argv element */
		if (is_argv_end(ps, argc, argv)) {
			ps->optopt = longopts[match].flag ? 0 : longopts[match].val;
			ps->nextchar = NULL;
			return optstring[0] == ':' ? ':' : '?';
		}

		ps->optarg = argv[ps->optind++];
	}

	ps->nextchar = NULL;

	if (longopts[match].flag != NULL) {
		*longopts[match].flag = longopts[match].val;
		return 0;
	}

	return longopts[match].val;
}